

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::delta(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *__return_storage_ptr__,
       SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *this)

{
  Tolerances *this_00;
  Real RVar1;
  Real RVar2;
  double val;
  
  RVar1 = Tolerances::floatingPointFeastol
                    ((this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  RVar2 = Tolerances::floatingPointOpttol
                    ((this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this_00 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (RVar1 <= RVar2) {
    val = Tolerances::floatingPointOpttol(this_00);
  }
  else {
    val = Tolerances::floatingPointFeastol(this_00);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,val,(type *)0x0);
  return __return_storage_ptr__;
}

Assistant:

R delta() const
   {
      return SOPLEX_MAX(this->tolerances()->floatingPointFeastol(),
                        this->tolerances()->floatingPointOpttol());
   }